

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnDelegateExpr
          (ExprVisitorDelegate *this,TryExpr *expr)

{
  WatWriter *this_00;
  char *s;
  
  Dedent(this->writer_);
  ModuleContext::EndBlock(&this->writer_->super_ModuleContext);
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::Delegate_Opcode);
  WritePutsSpace(this_00,s);
  WriteVar(this->writer_,&expr->delegate_target,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnDelegateExpr(TryExpr* expr) {
  writer_->Dedent();
  writer_->EndBlock();
  writer_->WritePutsSpace(Opcode::Delegate_Opcode.GetName());
  writer_->WriteVar(expr->delegate_target, NextChar::Newline);
  return Result::Ok;
}